

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# put_data.cpp
# Opt level: O0

void __thiscall libtorrent::dht::put_data::done(put_data *this)

{
  uint32_t uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  node *this_00;
  dht_observer *pdVar5;
  undefined4 extraout_var;
  put_data *this_local;
  
  this->m_done = true;
  this_00 = traversal_algorithm::get_node(&this->super_traversal_algorithm);
  pdVar5 = dht::node::observer(this_00);
  uVar1 = traversal_algorithm::id(&this->super_traversal_algorithm);
  iVar2 = (*(this->super_traversal_algorithm)._vptr_traversal_algorithm[2])();
  uVar3 = traversal_algorithm::num_responses(&this->super_traversal_algorithm);
  iVar4 = traversal_algorithm::num_timeouts(&this->super_traversal_algorithm);
  (*(pdVar5->super_dht_logger)._vptr_dht_logger[1])
            (pdVar5,4,"[%u] %s DONE, response %d, timeout %d",(ulong)uVar1,
             CONCAT44(extraout_var,iVar2),(ulong)uVar3,iVar4);
  iVar2 = traversal_algorithm::num_responses(&this->super_traversal_algorithm);
  ::std::function<void_(const_libtorrent::dht::item_&,_int)>::operator()
            (&this->m_put_callback,&this->m_data,iVar2);
  traversal_algorithm::done(&this->super_traversal_algorithm);
  return;
}

Assistant:

void put_data::done()
{
	m_done = true;

#ifndef TORRENT_DISABLE_LOGGING
	get_node().observer()->log(dht_logger::traversal, "[%u] %s DONE, response %d, timeout %d"
		, id(), name(), num_responses(), num_timeouts());
#endif

	m_put_callback(m_data, num_responses());
	traversal_algorithm::done();
}